

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  int y;
  int width;
  int x;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    windows_0 = open_window("First",(GLFWwindow *)0x0,0x32,0x32);
    if (windows_0 != (GLFWwindow *)0x0) {
      glGenTextures(1,&y);
      glBindTexture(0xde1,y);
      piVar3 = &x;
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
          iVar1 = rand();
          *(char *)((long)piVar3 + lVar5) = (char)iVar1;
        }
        piVar3 = piVar3 + 0x40;
      }
      glTexImage2D(0xde1,0,0x1909,0x100,0x100,0,0x1909,0x1401,&x);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexParameteri(0xde1,0x2800,0x2601);
      iVar1 = y;
      glfwGetWindowPos(windows_0,&x,&y);
      glfwGetWindowSize(windows_0,&width,(int *)0x0);
      windows_1 = open_window("Second",windows_0,x + width + 0x32,y);
      if (windows_1 != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(windows_0);
        glColor3f(0x3f19999a,0,0x3f19999a);
        glfwMakeContextCurrent(windows_1);
        glColor3f(0x3f19999a,0x3f19999a,0);
        glfwMakeContextCurrent(windows_0);
        while( true ) {
          iVar2 = glfwWindowShouldClose(windows_0);
          if (iVar2 != 0) break;
          iVar2 = glfwWindowShouldClose(windows_1);
          if (iVar2 != 0) break;
          glfwMakeContextCurrent(windows_0);
          draw_quad(iVar1);
          glfwMakeContextCurrent(windows_1);
          draw_quad(iVar1);
          glfwSwapBuffers(windows_0);
          glfwSwapBuffers(windows_1);
          glfwWaitEvents();
        }
        glfwTerminate();
        exit(0);
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int x, y, width;
    GLuint texture;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    windows[0] = open_window("First", NULL, OFFSET, OFFSET);
    if (!windows[0])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // This is the one and only time we create a texture
    // It is created inside the first context, created above
    // It will then be shared with the second context, created below
    texture = create_texture();

    glfwGetWindowPos(windows[0], &x, &y);
    glfwGetWindowSize(windows[0], &width, NULL);

    // Put the second window to the right of the first one
    windows[1] = open_window("Second", windows[0], x + width + OFFSET, y);
    if (!windows[1])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Set drawing color for both contexts
    glfwMakeContextCurrent(windows[0]);
    glColor3f(0.6f, 0.f, 0.6f);
    glfwMakeContextCurrent(windows[1]);
    glColor3f(0.6f, 0.6f, 0.f);

    glfwMakeContextCurrent(windows[0]);

    while (!glfwWindowShouldClose(windows[0]) &&
           !glfwWindowShouldClose(windows[1]))
    {
        glfwMakeContextCurrent(windows[0]);
        draw_quad(texture);

        glfwMakeContextCurrent(windows[1]);
        draw_quad(texture);

        glfwSwapBuffers(windows[0]);
        glfwSwapBuffers(windows[1]);

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}